

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O0

bool __thiscall
draco::
PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
::ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_6)

{
  undefined1 auVar1 [16];
  Transform *this_00;
  int *__p;
  unique_ptr<int[],_std::default_delete<int[]>_> *this_01;
  int in_ECX;
  PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
  *in_RDI;
  int in_R8D;
  DataType *in_R9;
  int i;
  unique_ptr<int[],_std::default_delete<int[]>_> zero_vals;
  undefined4 local_40;
  DataType *in_stack_ffffffffffffffc8;
  CorrType *in_stack_ffffffffffffffd0;
  int iVar2;
  
  this_00 = PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
            ::transform(in_RDI);
  PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::Init(this_00,in_R8D);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_R8D;
  __p = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __p = (int *)0xffffffffffffffff;
  }
  this_01 = (unique_ptr<int[],_std::default_delete<int[]>_> *)operator_new__((ulong)__p);
  memset(this_01,0,(size_t)__p);
  std::unique_ptr<int[],std::default_delete<int[]>>::
  unique_ptr<int*,std::default_delete<int[]>,void,bool>(this_01,__p);
  PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
  ::transform(in_RDI);
  std::unique_ptr<int[],_std::default_delete<int[]>_>::get(this_01);
  local_40 = in_R8D;
  PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
            ((PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)
             CONCAT44(in_ECX,in_R8D),in_R9,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  iVar2 = local_40;
  for (; local_40 < in_ECX; local_40 = iVar2 + local_40) {
    PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>
    ::transform(in_RDI);
    PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>::ComputeOriginalValue
              ((PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *)
               CONCAT44(in_ECX,iVar2),in_R9,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr(this_01);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}